

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_dist_graph_neighbors_count_
               (MPIABI_Fint *comm,int *indegree,int *outdegree,int *weighted,MPIABI_Fint *ierror)

{
  MPIABI_Fint *ierror_local;
  int *weighted_local;
  int *outdegree_local;
  int *indegree_local;
  MPIABI_Fint *comm_local;
  
  mpi_dist_graph_neighbors_count_(comm,indegree,outdegree,weighted,ierror);
  return;
}

Assistant:

void mpiabi_dist_graph_neighbors_count_(
  const MPIABI_Fint * comm,
  int * indegree,
  int * outdegree,
  int * weighted,
  MPIABI_Fint * ierror
) {
  return mpi_dist_graph_neighbors_count_(
    comm,
    indegree,
    outdegree,
    weighted,
    ierror
  );
}